

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Switch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Switch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  const_reference pvVar2;
  pointer pAVar3;
  size_type sVar4;
  reference this_01;
  Dispatch_Engine *pDVar5;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar6;
  string_view t_name;
  bool local_151;
  Break_Loop *anon_var_0;
  bad_boxed_cast *anon_var_0_1;
  byte local_b9;
  Function_Params local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  undefined1 local_98 [24];
  undefined1 local_80 [8];
  array<chaiscript::Boxed_Value,_2UL> p;
  undefined1 local_50 [8];
  Boxed_Value match_value;
  Scope_Push_Pop spp;
  undefined1 auStack_30 [7];
  bool hasMatched;
  size_t currentCase;
  bool breaking;
  Dispatch_State *t_ss_local;
  Switch_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this_local;
  
  _auStack_30 = 1;
  bVar1 = false;
  detail::Scope_Push_Pop::Scope_Push_Pop
            ((Scope_Push_Pop *)
             &match_value.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,in_RDX);
  pvVar2 = Catch::clara::std::
           vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                         *)&t_ss[2].m_conversions,0);
  pAVar3 = Catch::clara::std::
           unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
           ::operator->(pvVar2);
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_50,
             (Dispatch_State *)pAVar3);
  for (; sVar4 = Catch::clara::std::
                 vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                 ::size((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                         *)&t_ss[2].m_conversions), (ulong)_auStack_30 < sVar4;
      _auStack_30 = _auStack_30 + 1) {
    pvVar2 = Catch::clara::std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
             ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                           *)&t_ss[2].m_conversions,_auStack_30);
    pAVar3 = Catch::clara::std::
             unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
             ::operator->(pvVar2);
    if ((pAVar3->super_AST_Node).identifier == Case) {
      local_98._16_8_ = local_80;
      Boxed_Value::Boxed_Value((Boxed_Value *)local_98._16_8_,(Boxed_Value *)local_50);
      this_00 = &p._M_elems[0].m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      local_98._16_8_ = this_00;
      pvVar2 = Catch::clara::std::
               vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                             *)&t_ss[2].m_conversions,_auStack_30);
      pAVar3 = Catch::clara::std::
               unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
               ::operator->(pvVar2);
      this_01 = Catch::clara::std::
                vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                ::operator[](&pAVar3->children,0);
      pAVar3 = Catch::clara::std::
               unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
               ::operator->(this_01);
      AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)this_00,
                 (Dispatch_State *)pAVar3);
      local_b9 = 0;
      local_151 = true;
      if (!bVar1) {
        pDVar5 = chaiscript::detail::Dispatch_State::operator->(in_RDX);
        Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_a8,"==");
        Function_Params::Function_Params<2ul>
                  (&local_b8,(array<chaiscript::Boxed_Value,_2UL> *)local_80);
        chaiscript::detail::Dispatch_State::conversions(in_RDX);
        t_name._M_str = (char *)local_a8._M_len;
        t_name._M_len = (size_t)pDVar5;
        chaiscript::detail::Dispatch_Engine::call_function
                  ((Dispatch_Engine *)local_98,t_name,(atomic_uint_fast32_t *)local_a8._M_str,
                   (Function_Params *)&t_ss[3].m_stack_holder,(Type_Conversions_State *)&local_b8);
        local_b9 = 1;
        local_151 = boxed_cast<bool>((Boxed_Value *)local_98,(Type_Conversions_State *)0x0);
      }
      if ((local_b9 & 1) != 0) {
        Boxed_Value::~Boxed_Value((Boxed_Value *)local_98);
      }
      if (local_151 != false) {
        pvVar2 = Catch::clara::std::
                 vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                 ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                               *)&t_ss[2].m_conversions,_auStack_30);
        pAVar3 = Catch::clara::std::
                 unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
                 ::operator->(pvVar2);
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)&anon_var_0_1,
                   (Dispatch_State *)pAVar3);
        Boxed_Value::~Boxed_Value((Boxed_Value *)&anon_var_0_1);
        bVar1 = true;
      }
      Catch::clara::std::array<chaiscript::Boxed_Value,_2UL>::~array
                ((array<chaiscript::Boxed_Value,_2UL> *)local_80);
    }
    else {
      pvVar2 = Catch::clara::std::
               vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
               ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                             *)&t_ss[2].m_conversions,_auStack_30);
      pAVar3 = Catch::clara::std::
               unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
               ::operator->(pvVar2);
      if ((pAVar3->super_AST_Node).identifier == Default) {
        pvVar2 = Catch::clara::std::
                 vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                 ::operator[]((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
                               *)&t_ss[2].m_conversions,_auStack_30);
        pAVar3 = Catch::clara::std::
                 unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
                 ::operator->(pvVar2);
        AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)&anon_var_0,
                   (Dispatch_State *)pAVar3);
        Boxed_Value::~Boxed_Value((Boxed_Value *)&anon_var_0);
        bVar1 = true;
      }
    }
  }
  void_var();
  Boxed_Value::~Boxed_Value((Boxed_Value *)local_50);
  detail::Scope_Push_Pop::~Scope_Push_Pop
            ((Scope_Push_Pop *)
             &match_value.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        bool breaking = false;
        size_t currentCase = 1;
        bool hasMatched = false;

        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        Boxed_Value match_value(this->children[0]->eval(t_ss));

        while (!breaking && (currentCase < this->children.size())) {
          try {
            if (this->children[currentCase]->identifier == AST_Node_Type::Case) {
              // This is a little odd, but because want to see both the switch and the case simultaneously, I do a downcast here.
              try {
                std::array<Boxed_Value, 2> p{match_value, this->children[currentCase]->children[0]->eval(t_ss)};
                if (hasMatched || boxed_cast<bool>(t_ss->call_function("==", m_loc, Function_Params{p}, t_ss.conversions()))) {
                  this->children[currentCase]->eval(t_ss);
                  hasMatched = true;
                }
              } catch (const exception::bad_boxed_cast &) {
                throw exception::eval_error("Internal error: case guard evaluation not boolean");
              }
            } else if (this->children[currentCase]->identifier == AST_Node_Type::Default) {
              this->children[currentCase]->eval(t_ss);
              hasMatched = true;
            }
          } catch (detail::Break_Loop &) {
            breaking = true;
          }
          ++currentCase;
        }
        return void_var();
      }